

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_asn1.cc
# Opt level: O2

ECDSA_SIG * ECDSA_SIG_parse(CBS *cbs)

{
  int iVar1;
  ECDSA_SIG *sig;
  CBS child;
  
  sig = ECDSA_SIG_new();
  if (sig != (ECDSA_SIG *)0x0) {
    iVar1 = CBS_get_asn1(cbs,&child,0x20000010);
    if ((((iVar1 != 0) && (iVar1 = BN_parse_asn1_unsigned(&child,(BIGNUM *)sig->r), iVar1 != 0)) &&
        (iVar1 = BN_parse_asn1_unsigned(&child,(BIGNUM *)sig->s), iVar1 != 0)) && (child.len == 0))
    {
      return (ECDSA_SIG *)sig;
    }
    ERR_put_error(0x1a,0,100,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdsa/ecdsa_asn1.cc"
                  ,0xf9);
    ECDSA_SIG_free(sig);
  }
  return (ECDSA_SIG *)0x0;
}

Assistant:

ECDSA_SIG *ECDSA_SIG_parse(CBS *cbs) {
  ECDSA_SIG *ret = ECDSA_SIG_new();
  if (ret == NULL) {
    return NULL;
  }
  CBS child;
  if (!CBS_get_asn1(cbs, &child, CBS_ASN1_SEQUENCE) ||
      !BN_parse_asn1_unsigned(&child, ret->r) ||
      !BN_parse_asn1_unsigned(&child, ret->s) || CBS_len(&child) != 0) {
    OPENSSL_PUT_ERROR(ECDSA, ECDSA_R_BAD_SIGNATURE);
    ECDSA_SIG_free(ret);
    return NULL;
  }
  return ret;
}